

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

string * __thiscall
ParserProbModelXML::GetVariableComment_abi_cxx11_(ParserProbModelXML *this,xmlNodePtr node)

{
  xmlXPathObjectPtr pxVar1;
  xmlDocPtr pxVar2;
  char *pcVar3;
  ParserProbModelXML *in_RSI;
  ParserProbModelXML *in_RDI;
  xmlXPathObjectPtr comment_node;
  string *comment;
  xmlNodePtr in_stack_ffffffffffffff98;
  xmlChar *in_stack_ffffffffffffffa0;
  ParserProbModelXML *this_00;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  __a = &local_1a;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,__a);
  std::allocator<char>::~allocator(&local_1a);
  pxVar1 = GetNodesMatchingExpression(this_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (pxVar1 != (xmlXPathObjectPtr)0x0) {
    pxVar2 = GetDoc(in_RSI);
    pcVar3 = (char *)xmlNodeListGetString(pxVar2,(*pxVar1->nodesetval->nodeTab)->children,1);
    std::__cxx11::string::operator=((string *)in_RDI,pcVar3);
    xmlXPathFreeObject(pxVar1);
  }
  return (string *)this_00;
}

Assistant:

std::string ParserProbModelXML::GetVariableComment(const xmlNodePtr node)
{
    //only works for plain text comments so far.
    string comment = "";
    xmlXPathObjectPtr comment_node = GetNodesMatchingExpression((xmlChar*) "Comment",node);
    if(comment_node != NULL)
    {
        comment = (char*) xmlNodeListGetString(GetDoc(), comment_node->nodesetval->nodeTab[0]->xmlChildrenNode, 1);
        if(DEBUG_PARSE)
        {
            cout << "read comment: " << comment << endl;
        }
        xmlXPathFreeObject (comment_node);
    }
    return comment;
}